

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathCompFunctionCall(xmlXPathParserContextPtr ctxt)

{
  int iVar1;
  bool bVar2;
  int local_28;
  int op1;
  int sort;
  int nbargs;
  xmlChar *prefix;
  xmlChar *name;
  xmlXPathParserContextPtr ctxt_local;
  
  op1 = 0;
  local_28 = 1;
  name = (xmlChar *)ctxt;
  prefix = xmlXPathParseQName(ctxt,(xmlChar **)&sort);
  if (prefix == (xmlChar *)0x0) {
    (*xmlFree)(_sort);
    xmlXPathErr((xmlXPathParserContextPtr)name,7);
  }
  else {
    while( true ) {
      bVar2 = true;
      if ((**(char **)name != ' ') &&
         ((**(byte **)name < 9 || (bVar2 = true, 10 < **(byte **)name)))) {
        bVar2 = **(char **)name == '\r';
      }
      if (!bVar2) break;
      if (**(char **)name != '\0') {
        *(long *)name = *(long *)name + 1;
      }
    }
    if (**(char **)name == '(') {
      if (**(char **)name != '\0') {
        *(long *)name = *(long *)name + 1;
      }
      while( true ) {
        bVar2 = true;
        if ((**(char **)name != ' ') &&
           ((**(byte **)name < 9 || (bVar2 = true, 10 < **(byte **)name)))) {
          bVar2 = **(char **)name == '\r';
        }
        if (!bVar2) break;
        if (**(char **)name != '\0') {
          *(long *)name = *(long *)name + 1;
        }
      }
      if (((_sort == (xmlChar *)0x0) && (*prefix == 'c')) &&
         (iVar1 = xmlStrEqual(prefix,(xmlChar *)"count"), iVar1 != 0)) {
        local_28 = 0;
      }
      *(undefined4 *)(*(long *)(name + 0x38) + 0x10) = 0xffffffff;
      if (**(char **)name != ')') {
        while (**(char **)name != '\0') {
          iVar1 = *(int *)(*(long *)(name + 0x38) + 0x10);
          *(undefined4 *)(*(long *)(name + 0x38) + 0x10) = 0xffffffff;
          xmlXPathCompileExpr((xmlXPathParserContextPtr)name,local_28);
          if (*(int *)(name + 0x10) != 0) {
            (*xmlFree)(prefix);
            (*xmlFree)(_sort);
            return;
          }
          xmlXPathCompExprAdd((xmlXPathParserContextPtr)name,iVar1,
                              *(int *)(*(long *)(name + 0x38) + 0x10),XPATH_OP_ARG,0,0,0,(void *)0x0
                              ,(void *)0x0);
          op1 = op1 + 1;
          if (**(char **)name == ')') break;
          if (**(char **)name != ',') {
            (*xmlFree)(prefix);
            (*xmlFree)(_sort);
            xmlXPathErr((xmlXPathParserContextPtr)name,7);
            return;
          }
          if (**(char **)name != '\0') {
            *(long *)name = *(long *)name + 1;
          }
          while( true ) {
            bVar2 = true;
            if ((**(char **)name != ' ') &&
               ((**(byte **)name < 9 || (bVar2 = true, 10 < **(byte **)name)))) {
              bVar2 = **(char **)name == '\r';
            }
            if (!bVar2) break;
            if (**(char **)name != '\0') {
              *(long *)name = *(long *)name + 1;
            }
          }
        }
      }
      iVar1 = xmlXPathCompExprAdd((xmlXPathParserContextPtr)name,
                                  *(int *)(*(long *)(name + 0x38) + 0x10),-1,XPATH_OP_FUNCTION,op1,0
                                  ,0,prefix,_sort);
      if (iVar1 == -1) {
        (*xmlFree)(_sort);
        (*xmlFree)(prefix);
      }
      if (**(char **)name != '\0') {
        *(long *)name = *(long *)name + 1;
      }
      while( true ) {
        bVar2 = true;
        if ((**(char **)name != ' ') &&
           ((**(byte **)name < 9 || (bVar2 = true, 10 < **(byte **)name)))) {
          bVar2 = **(char **)name == '\r';
        }
        if (!bVar2) break;
        if (**(char **)name != '\0') {
          *(long *)name = *(long *)name + 1;
        }
      }
    }
    else {
      (*xmlFree)(prefix);
      (*xmlFree)(_sort);
      xmlXPathErr((xmlXPathParserContextPtr)name,7);
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompFunctionCall(xmlXPathParserContextPtr ctxt) {
    xmlChar *name;
    xmlChar *prefix;
    int nbargs = 0;
    int sort = 1;

    name = xmlXPathParseQName(ctxt, &prefix);
    if (name == NULL) {
	xmlFree(prefix);
	XP_ERROR(XPATH_EXPR_ERROR);
    }
    SKIP_BLANKS;

    if (CUR != '(') {
	xmlFree(name);
	xmlFree(prefix);
	XP_ERROR(XPATH_EXPR_ERROR);
    }
    NEXT;
    SKIP_BLANKS;

    /*
    * Optimization for count(): we don't need the node-set to be sorted.
    */
    if ((prefix == NULL) && (name[0] == 'c') &&
	xmlStrEqual(name, BAD_CAST "count"))
    {
	sort = 0;
    }
    ctxt->comp->last = -1;
    if (CUR != ')') {
	while (CUR != 0) {
	    int op1 = ctxt->comp->last;
	    ctxt->comp->last = -1;
	    xmlXPathCompileExpr(ctxt, sort);
	    if (ctxt->error != XPATH_EXPRESSION_OK) {
		xmlFree(name);
		xmlFree(prefix);
		return;
	    }
	    PUSH_BINARY_EXPR(XPATH_OP_ARG, op1, ctxt->comp->last, 0, 0);
	    nbargs++;
	    if (CUR == ')') break;
	    if (CUR != ',') {
		xmlFree(name);
		xmlFree(prefix);
		XP_ERROR(XPATH_EXPR_ERROR);
	    }
	    NEXT;
	    SKIP_BLANKS;
	}
    }
    if (PUSH_LONG_EXPR(XPATH_OP_FUNCTION, nbargs, 0, 0, name, prefix) == -1) {
        xmlFree(prefix);
        xmlFree(name);
    }
    NEXT;
    SKIP_BLANKS;
}